

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_header(CompilerGLSL *this)

{
  ExecutionModel EVar1;
  Precision PVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  CompilerError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  Candidate *pCVar7;
  char *pcVar8;
  char **ts_2;
  CompilerGLSL *wg_y_00;
  Candidate c;
  bool local_a91;
  string local_a68;
  string local_a48;
  Capability *local_a28;
  Capability *cap;
  Capability *__end1_2;
  Capability *__begin1_2;
  SmallVector<spv::Capability,_8UL> *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  allocator local_9d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  allocator local_9b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  allocator local_989;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  allocator local_961;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  TypedID<(spirv_cross::Types)3> local_8a0;
  TypedID<(spirv_cross::Types)3> local_89c;
  TypedID<(spirv_cross::Types)3> local_898;
  SpecializationConstant local_894;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  allocator local_851;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  allocator local_829;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  allocator local_801;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  allocator local_7d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  allocator local_7b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  allocator local_789;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  allocator local_761;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  allocator local_739;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  string local_718;
  allocator local_6f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  allocator local_6c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  allocator local_6a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  string local_680;
  allocator local_659;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  allocator local_631;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator local_609;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  allocator local_5e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  allocator local_5b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  string local_598;
  string local_578;
  undefined1 local_558 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  outputs;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1_1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin4;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range4;
  char *local_2e0;
  undefined1 local_2d8 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  extra_names;
  char *extra_predicate;
  char *name;
  Candidate *ext_1;
  Candidate *__end3;
  Candidate *__begin3;
  CandidateVector *__range3;
  undefined1 local_188 [8];
  CandidateVector exts;
  Feature feature;
  uint32_t feature_index;
  Result result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  bool local_7a;
  allocator local_79;
  undefined1 local_78 [6];
  bool interlock_used;
  allocator local_41;
  string local_40;
  char *local_20;
  SPIREntryPoint *local_18;
  SPIREntryPoint *execution;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)this;
  local_18 = Compiler::get_entry_point(&this->super_Compiler);
  bVar3 = false;
  if (((this->options).es & 1U) != 0) {
    bVar3 = 100 < (this->options).version;
  }
  local_20 = "";
  if (bVar3) {
    local_20 = " es";
  }
  ts_2 = &local_20;
  statement<char_const(&)[10],unsigned_int&,char_const*>
            (this,(char (*) [10])"#version ",&(this->options).version,ts_2);
  if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1a4)) {
    if (((this->options).enable_420pack_extension & 1U) != 0) {
      statement<char_const(&)[39]>(this,(char (*) [39])"#ifdef GL_ARB_shading_language_420pack");
      statement<char_const(&)[53]>
                (this,(char (*) [53])"#extension GL_ARB_shading_language_420pack : require");
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    bVar3 = Bitset::get(&local_18->flags,9);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_40,"GL_ARB_shader_image_load_store",&local_41)
      ;
      require_extension_internal(this,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  bVar3 = Bitset::get(&local_18->flags,0x115e);
  if (bVar3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_78,"GL_ARB_post_depth_coverage",&local_79);
    require_extension_internal(this,(string *)local_78);
    ::std::__cxx11::string::~string((string *)local_78);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  bVar3 = Bitset::get(&local_18->flags,0x14f6);
  wg_y_00 = (CompilerGLSL *)CONCAT71((int7)((ulong)ts_2 >> 8),bVar3);
  local_a91 = true;
  if (!bVar3) {
    bVar3 = Bitset::get(&local_18->flags,0x14f7);
    wg_y_00 = (CompilerGLSL *)CONCAT71((int7)((ulong)wg_y_00 >> 8),bVar3);
    local_a91 = true;
    if (!bVar3) {
      bVar3 = Bitset::get(&local_18->flags,0x14f8);
      wg_y_00 = (CompilerGLSL *)CONCAT71((int7)((ulong)wg_y_00 >> 8),bVar3);
      local_a91 = true;
      if (!bVar3) {
        local_a91 = Bitset::get(&local_18->flags,0x14f9);
      }
    }
  }
  local_7a = local_a91;
  if (local_a91 != false) {
    if (((this->options).es & 1U) == 0) {
      if ((this->options).version < 0x1a4) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_c8,"GL_ARB_shader_image_load_store",&local_c9);
        require_extension_internal(this,&local_c8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_f0,"GL_ARB_fragment_shader_interlock",
                 (allocator *)((long)&__range1 + 7));
      require_extension_internal(this,&local_f0);
      ::std::__cxx11::string::~string((string *)&local_f0);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    }
    else {
      if ((this->options).version < 0x136) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"At least ESSL 3.10 required for fragment shader interlock.");
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_a0,"GL_NV_fragment_shader_interlock",&local_a1);
      require_extension_internal(this,&local_a0);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  __end1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(&(this->forced_extensions).
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
  pbVar6 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&(this->forced_extensions).
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  for (; __end1 != pbVar6; __end1 = __end1 + 1) {
    result.weights._32_8_ = __end1;
    bVar3 = ::std::operator==(__end1,"GL_ARB_gpu_shader_int64");
    if (bVar3) {
      statement<char_const(&)[37]>(this,(char (*) [37])"#if defined(GL_ARB_gpu_shader_int64)");
      statement<char_const(&)[45]>
                (this,(char (*) [45])"#extension GL_ARB_gpu_shader_int64 : require");
      if ((((this->options).vulkan_semantics & 1U) == 0) || (((this->options).es & 1U) != 0)) {
        statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
        statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
      }
      statement<char_const(&)[6]>(this,(char (*) [6])"#else");
      statement<char_const(&)[51]>
                (this,(char (*) [51])"#error No extension available for 64-bit integers.");
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    else {
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )result.weights._32_8_,
                                "GL_EXT_shader_explicit_arithmetic_types_float16");
      if (bVar3) {
        statement<char_const(&)[42]>
                  (this,(char (*) [42])"#if defined(GL_AMD_gpu_shader_half_float)");
        statement<char_const(&)[50]>
                  (this,(char (*) [50])"#extension GL_AMD_gpu_shader_half_float : require");
        if (((this->options).vulkan_semantics & 1U) == 0) {
          statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
          statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require")
          ;
        }
        else {
          statement<char_const(&)[63]>
                    (this,(char (*) [63])
                          "#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
          statement<char_const(&)[69]>
                    (this,(char (*) [69])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
        }
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        statement<char_const(&)[40]>(this,(char (*) [40])"#error No extension available for FP16.");
        statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
      }
      else {
        bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)result.weights._32_8_,
                                  "GL_EXT_shader_explicit_arithmetic_types_int8");
        if (bVar3) {
          if (((this->options).vulkan_semantics & 1U) == 0) {
            statement<char_const(&)[58]>
                      (this,(char (*) [58])
                            "#if defined(GL_EXT_shader_explicit_arithmetic_types_int8)");
            statement<char_const(&)[66]>
                      (this,(char (*) [66])
                            "#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
            statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
            statement<char_const(&)[39]>
                      (this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[40]>
                      (this,(char (*) [40])"#error No extension available for Int8.");
            statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
          }
          else {
            statement<char_const(&)[66]>
                      (this,(char (*) [66])
                            "#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
          }
        }
        else {
          bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)result.weights._32_8_,
                                    "GL_EXT_shader_explicit_arithmetic_types_int16");
          if (bVar3) {
            if (((this->options).vulkan_semantics & 1U) == 0) {
              statement<char_const(&)[59]>
                        (this,(char (*) [59])
                              "#if defined(GL_EXT_shader_explicit_arithmetic_types_int16)");
              statement<char_const(&)[67]>
                        (this,(char (*) [67])
                              "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
              statement<char_const(&)[39]>
                        (this,(char (*) [39])"#elif defined(GL_AMD_gpu_shader_int16)");
              statement<char_const(&)[45]>
                        (this,(char (*) [45])"#extension GL_AMD_gpu_shader_int16 : require");
              statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
              statement<char_const(&)[39]>
                        (this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
              statement<char_const(&)[6]>(this,(char (*) [6])"#else");
              statement<char_const(&)[41]>
                        (this,(char (*) [41])"#error No extension available for Int16.");
              statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
            }
            else {
              statement<char_const(&)[67]>
                        (this,(char (*) [67])
                              "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
            }
          }
          else {
            bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)result.weights._32_8_,"GL_ARB_post_depth_coverage");
            if (bVar3) {
              if (((this->options).es & 1U) == 0) {
                statement<char_const(&)[39]>
                          (this,(char (*) [39])"#if defined(GL_ARB_post_depth_coverge)");
                statement<char_const(&)[48]>
                          (this,(char (*) [48])"#extension GL_ARB_post_depth_coverage : require");
                statement<char_const(&)[6]>(this,(char (*) [6])"#else");
                statement<char_const(&)[48]>
                          (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
                statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
              }
              else {
                statement<char_const(&)[48]>
                          (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
              }
            }
            else if ((((this->options).vulkan_semantics & 1U) == 0) &&
                    (bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)result.weights._32_8_,
                                               "GL_ARB_shader_draw_parameters"), bVar3)) {
              statement<char_const(&)[8],std::__cxx11::string&>
                        (this,(char (*) [8])"#ifdef ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         result.weights._32_8_);
              wg_y_00 = (CompilerGLSL *)0x4a7a15;
              statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[10]>
                        (this,(char (*) [12])"#extension ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         result.weights._32_8_,(char (*) [10])0x4a7a15);
              statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
            }
            else {
              bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)result.weights._32_8_,"GL_EXT_control_flow_attributes");
              if (bVar3) {
                statement<char_const(&)[44]>
                          (this,(char (*) [44])"#if defined(GL_EXT_control_flow_attributes)");
                statement<char_const(&)[52]>
                          (this,(char (*) [52])"#extension GL_EXT_control_flow_attributes : require"
                          );
                statement<char_const(&)[40]>
                          (this,(char (*) [40])"#define SPIRV_CROSS_FLATTEN [[flatten]]");
                statement<char_const(&)[44]>
                          (this,(char (*) [44])"#define SPIRV_CROSS_BRANCH [[dont_flatten]]");
                statement<char_const(&)[38]>
                          (this,(char (*) [38])"#define SPIRV_CROSS_UNROLL [[unroll]]");
                statement<char_const(&)[41]>
                          (this,(char (*) [41])"#define SPIRV_CROSS_LOOP [[dont_unroll]]");
                statement<char_const(&)[6]>(this,(char (*) [6])"#else");
                statement<char_const(&)[28]>(this,(char (*) [28])"#define SPIRV_CROSS_FLATTEN");
                statement<char_const(&)[27]>(this,(char (*) [27])"#define SPIRV_CROSS_BRANCH");
                statement<char_const(&)[27]>(this,(char (*) [27])"#define SPIRV_CROSS_UNROLL");
                statement<char_const(&)[25]>(this,(char (*) [25])"#define SPIRV_CROSS_LOOP");
                statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
              }
              else {
                bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)result.weights._32_8_,"GL_NV_fragment_shader_interlock"
                                         );
                if (bVar3) {
                  statement<char_const(&)[53]>
                            (this,(char (*) [53])
                                  "#extension GL_NV_fragment_shader_interlock : require");
                  statement<char_const(&)[76]>
                            (this,(char (*) [76])
                                  "#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockNV()"
                            );
                  statement<char_const(&)[72]>
                            (this,(char (*) [72])
                                  "#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockNV()"
                            );
                }
                else {
                  bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)result.weights._32_8_,
                                            "GL_ARB_fragment_shader_interlock");
                  if (bVar3) {
                    statement<char_const(&)[40]>
                              (this,(char (*) [40])"#ifdef GL_ARB_fragment_shader_interlock");
                    statement<char_const(&)[53]>
                              (this,(char (*) [53])
                                    "#extension GL_ARB_fragment_shader_interlock : enable");
                    statement<char_const(&)[77]>
                              (this,(char (*) [77])
                                    "#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockARB()"
                              );
                    statement<char_const(&)[73]>
                              (this,(char (*) [73])
                                    "#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockARB()"
                              );
                    statement<char_const(&)[49]>
                              (this,(char (*) [49])
                                    "#elif defined(GL_INTEL_fragment_shader_ordering)");
                    statement<char_const(&)[54]>
                              (this,(char (*) [54])
                                    "#extension GL_INTEL_fragment_shader_ordering : enable");
                    statement<char_const(&)[82]>
                              (this,(char (*) [82])
                                    "#define SPIRV_Cross_beginInvocationInterlock() beginFragmentShaderOrderingINTEL()"
                              );
                    statement<char_const(&)[45]>
                              (this,(char (*) [45])"#define SPIRV_Cross_endInvocationInterlock()");
                    statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
                  }
                  else {
                    wg_y_00 = (CompilerGLSL *)0x4a7216;
                    statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[11]>
                              (this,(char (*) [12])"#extension ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               result.weights._32_8_,(char (*) [11])0x4a7216);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (((this->options).vulkan_semantics & 1U) == 0) {
    ShaderSubgroupSupportHelper::resolve((Result *)&feature,&this->shader_subgroup_supporter);
    exts.stack_storage.aligned_char[0x24] = '\0';
    exts.stack_storage.aligned_char[0x25] = '\0';
    exts.stack_storage.aligned_char[0x26] = '\0';
    exts.stack_storage.aligned_char[0x27] = '\0';
    for (; (uint)exts.stack_storage.aligned_char._36_4_ < 0x1c;
        exts.stack_storage.aligned_char._36_4_ = exts.stack_storage.aligned_char._36_4_ + 1) {
      exts.stack_storage.aligned_char[0x20] = exts.stack_storage.aligned_char[0x24];
      exts.stack_storage.aligned_char[0x21] = exts.stack_storage.aligned_char[0x25];
      exts.stack_storage.aligned_char[0x22] = exts.stack_storage.aligned_char[0x26];
      exts.stack_storage.aligned_char[0x23] = exts.stack_storage.aligned_char[0x27];
      bVar3 = ShaderSubgroupSupportHelper::is_feature_requested
                        (&this->shader_subgroup_supporter,exts.stack_storage.aligned_char._36_4_);
      if (bVar3) {
        ShaderSubgroupSupportHelper::get_candidates_for_feature
                  ((CandidateVector *)local_188,exts.stack_storage.aligned_char._32_4_,
                   (Result *)&feature);
        bVar3 = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::empty
                          ((VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                            *)local_188);
        if (bVar3) {
          __range3._4_4_ = 6;
        }
        else {
          statement<char_const(&)[1]>(this,(char (*) [1])0x48ca95);
          __begin3 = (Candidate *)local_188;
          __end3 = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::
                   begin((VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                          *)__begin3);
          ext_1 = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::end
                            ((VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                              *)__begin3);
          for (; __end3 != ext_1; __end3 = __end3 + 1) {
            name = (char *)__end3;
            extra_predicate = ShaderSubgroupSupportHelper::get_extension_name(*__end3);
            extra_names.stack_storage.aligned_char._248_8_ =
                 ShaderSubgroupSupportHelper::get_extra_required_extension_predicate
                           (*(Candidate *)name);
            ShaderSubgroupSupportHelper::get_extra_required_extension_names_abi_cxx11_
                      ((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_2d8,(ShaderSubgroupSupportHelper *)(ulong)*(uint *)name,c);
            pcVar8 = name;
            pCVar7 = VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>::
                     front((VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                            *)local_188);
            local_2e0 = "#if";
            if ((Candidate *)pcVar8 != pCVar7) {
              local_2e0 = "#elif";
            }
            pcVar8 = "";
            if (*(char *)extra_names.stack_storage.aligned_char._248_8_ != '\0') {
              pcVar8 = " && ";
            }
            __range4 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)pcVar8;
            statement<char_const*,char_const(&)[10],char_const*&,char_const(&)[2],char_const*,char_const*&>
                      (this,&local_2e0,(char (*) [10])" defined(",&extra_predicate,
                       (char (*) [2])0x4b01ae,(char **)&__range4,
                       (char **)(extra_names.stack_storage.aligned_char + 0xf8));
            __end4 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::begin((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_2d8);
            pbVar6 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::end((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_2d8);
            for (; __end4 != pbVar6; __end4 = __end4 + 1) {
              statement<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[10]>
                        (this,(char (*) [12])"#extension ",__end4,(char (*) [10])0x4a7a15);
            }
            wg_y_00 = (CompilerGLSL *)0x4a7216;
            statement<char_const(&)[12],char_const*&,char_const(&)[11]>
                      (this,(char (*) [12])"#extension ",&extra_predicate,(char (*) [11])0x4a7216);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                            *)local_2d8);
          }
          bVar3 = ShaderSubgroupSupportHelper::can_feature_be_implemented_without_extensions
                            (exts.stack_storage.aligned_char._32_4_);
          if (!bVar3) {
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[70]>
                      (this,(char (*) [70])
                            "#error No extensions available to emulate requested subgroup feature.")
            ;
          }
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
          __range3._4_4_ = 0;
        }
        SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
        ~SmallVector((SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                      *)local_188);
      }
    }
  }
  __end1_1 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(&(this->header_lines).
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
  pbVar6 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&(this->header_lines).
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  for (; __end1_1 != pbVar6; __end1_1 = __end1_1 + 1) {
    statement<std::__cxx11::string&>(this,__end1_1);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)(outputs.stack_storage.aligned_char + 0xf8));
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_558);
  EVar1 = local_18->model;
  if (EVar1 == ExecutionModelVertex) {
    if ((this->options).ovr_multiview_view_count != 0) {
      join<char_const(&)[13],unsigned_int&>
                (&local_578,(spirv_cross *)"num_views = ",
                 (char (*) [13])&(this->options).ovr_multiview_view_count,(uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_578);
      ::std::__cxx11::string::~string((string *)&local_578);
    }
  }
  else if (EVar1 == ExecutionModelTessellationControl) {
    bVar3 = Bitset::get(&local_18->flags,0x1a);
    if (bVar3) {
      join<char_const(&)[12],unsigned_int&>
                (&local_718,(spirv_cross *)0x4a7b4d,(char (*) [12])&local_18->output_vertices,
                 (uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_558,&local_718);
      ::std::__cxx11::string::~string((string *)&local_718);
    }
  }
  else if (EVar1 == ExecutionModelTessellationEvaluation) {
    bVar3 = Bitset::get(&local_18->flags,0x18);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_738,"quads",&local_739);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_738);
      ::std::__cxx11::string::~string((string *)&local_738);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_739);
    }
    bVar3 = Bitset::get(&local_18->flags,0x16);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_760,"triangles",&local_761);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_760);
      ::std::__cxx11::string::~string((string *)&local_760);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_761);
    }
    bVar3 = Bitset::get(&local_18->flags,0x19);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_788,"isolines",&local_789);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_788);
      ::std::__cxx11::string::~string((string *)&local_788);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_789);
    }
    bVar3 = Bitset::get(&local_18->flags,10);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_7b0,"point_mode",&local_7b1);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_7b0);
      ::std::__cxx11::string::~string((string *)&local_7b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
    }
    bVar3 = Bitset::get(&local_18->flags,0x19);
    if (!bVar3) {
      bVar3 = Bitset::get(&local_18->flags,4);
      if (bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_7d8,"cw",&local_7d9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)(outputs.stack_storage.aligned_char + 0xf8),&local_7d8);
        ::std::__cxx11::string::~string((string *)&local_7d8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7d9);
      }
      bVar3 = Bitset::get(&local_18->flags,5);
      if (bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_800,"ccw",&local_801);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)(outputs.stack_storage.aligned_char + 0xf8),&local_800);
        ::std::__cxx11::string::~string((string *)&local_800);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_801);
      }
    }
    bVar3 = Bitset::get(&local_18->flags,2);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_828,"fractional_even_spacing",&local_829);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_828);
      ::std::__cxx11::string::~string((string *)&local_828);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_829);
    }
    bVar3 = Bitset::get(&local_18->flags,3);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_850,"fractional_odd_spacing",&local_851);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_850);
      ::std::__cxx11::string::~string((string *)&local_850);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_851);
    }
    bVar3 = Bitset::get(&local_18->flags,1);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&wg_x.constant_id,"equal_spacing",(allocator *)((long)&wg_x.id.id + 3));
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &wg_x.constant_id);
      ::std::__cxx11::string::~string((string *)&wg_x.constant_id);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&wg_x.id.id + 3));
    }
  }
  else if (EVar1 == ExecutionModelGeometry) {
    bVar3 = Bitset::get(&local_18->flags,0);
    if ((bVar3) && (local_18->invocations != 1)) {
      join<char_const(&)[15],unsigned_int&>
                (&local_598,(spirv_cross *)"invocations = ",(char (*) [15])&local_18->invocations,
                 (uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_598);
      ::std::__cxx11::string::~string((string *)&local_598);
    }
    bVar3 = Bitset::get(&local_18->flags,0x13);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_5b8,"points",&local_5b9);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_5b8);
      ::std::__cxx11::string::~string((string *)&local_5b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    }
    bVar3 = Bitset::get(&local_18->flags,0x14);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_5e0,"lines",&local_5e1);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_5e0);
      ::std::__cxx11::string::~string((string *)&local_5e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    }
    bVar3 = Bitset::get(&local_18->flags,0x15);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_608,"lines_adjacency",&local_609);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_608);
      ::std::__cxx11::string::~string((string *)&local_608);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_609);
    }
    bVar3 = Bitset::get(&local_18->flags,0x16);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_630,"triangles",&local_631);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_630);
      ::std::__cxx11::string::~string((string *)&local_630);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_631);
    }
    bVar3 = Bitset::get(&local_18->flags,0x17);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_658,"triangles_adjacency",&local_659);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_658);
      ::std::__cxx11::string::~string((string *)&local_658);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_659);
    }
    if ((local_18->geometry_passthrough & 1U) == 0) {
      join<char_const(&)[16],unsigned_int&>
                (&local_680,(spirv_cross *)"max_vertices = ",
                 (char (*) [16])&local_18->output_vertices,(uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_558,&local_680);
      ::std::__cxx11::string::~string((string *)&local_680);
      bVar3 = Bitset::get(&local_18->flags,0x1d);
      if (bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_6a0,"triangle_strip",&local_6a1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_558,&local_6a0);
        ::std::__cxx11::string::~string((string *)&local_6a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
      }
      bVar3 = Bitset::get(&local_18->flags,0x1b);
      if (bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_6c8,"points",&local_6c9);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_558,&local_6c8);
        ::std::__cxx11::string::~string((string *)&local_6c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
      }
      bVar3 = Bitset::get(&local_18->flags,0x1c);
      if (bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_6f0,"line_strip",&local_6f1);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_558,&local_6f0);
        ::std::__cxx11::string::~string((string *)&local_6f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
      }
    }
  }
  else if (EVar1 == ExecutionModelFragment) {
    if (((this->options).es & 1U) != 0) {
      PVar2 = (this->options).fragment.default_float_precision;
      if (PVar2 == Lowp) {
        statement<char_const(&)[22]>(this,(char (*) [22])"precision lowp float;");
      }
      else if (PVar2 == Mediump) {
        statement<char_const(&)[25]>(this,(char (*) [25])"precision mediump float;");
      }
      else if (PVar2 == Highp) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision highp float;");
      }
      PVar2 = (this->options).fragment.default_int_precision;
      if (PVar2 == Lowp) {
        statement<char_const(&)[20]>(this,(char (*) [20])"precision lowp int;");
      }
      else if (PVar2 == Mediump) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision mediump int;");
      }
      else if (PVar2 == Highp) {
        statement<char_const(&)[21]>(this,(char (*) [21])"precision highp int;");
      }
    }
    bVar3 = Bitset::get(&local_18->flags,9);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_9d8,"early_fragment_tests",&local_9d9);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_9d8);
      ::std::__cxx11::string::~string((string *)&local_9d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
    }
    bVar3 = Bitset::get(&local_18->flags,0x115e);
    if (bVar3) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_a00,"post_depth_coverage",(allocator *)((long)&__range1_2 + 7));
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_a00);
      ::std::__cxx11::string::~string((string *)&local_a00);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
    }
    if ((local_7a & 1U) != 0) {
      statement<char_const(&)[46]>
                (this,(char (*) [46])"#if defined(GL_ARB_fragment_shader_interlock)");
    }
    bVar3 = Bitset::get(&local_18->flags,0x14f6);
    if (bVar3) {
      statement<char_const(&)[36]>(this,(char (*) [36])"layout(pixel_interlock_ordered) in;");
    }
    else {
      bVar3 = Bitset::get(&local_18->flags,0x14f7);
      if (bVar3) {
        statement<char_const(&)[38]>(this,(char (*) [38])"layout(pixel_interlock_unordered) in;");
      }
      else {
        bVar3 = Bitset::get(&local_18->flags,0x14f8);
        if (bVar3) {
          statement<char_const(&)[37]>(this,(char (*) [37])"layout(sample_interlock_ordered) in;");
        }
        else {
          bVar3 = Bitset::get(&local_18->flags,0x14f9);
          if (bVar3) {
            statement<char_const(&)[39]>
                      (this,(char (*) [39])"layout(sample_interlock_unordered) in;");
          }
        }
      }
    }
    if ((local_7a & 1U) != 0) {
      statement<char_const(&)[50]>
                (this,(char (*) [50])"#elif !defined(GL_INTEL_fragment_shader_ordering)");
      statement<char_const(&)[61]>
                (this,(char (*) [61])"#error Fragment Shader Interlock/Ordering extension missing!")
      ;
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    if ((((this->options).es & 1U) == 0) && (bVar3 = Bitset::get(&local_18->flags,0xe), bVar3)) {
      statement<char_const(&)[46]>
                (this,(char (*) [46])"layout(depth_greater) out float gl_FragDepth;");
    }
    else if ((((this->options).es & 1U) == 0) && (bVar3 = Bitset::get(&local_18->flags,0xf), bVar3))
    {
      statement<char_const(&)[43]>(this,(char (*) [43])"layout(depth_less) out float gl_FragDepth;")
      ;
    }
  }
  else if ((EVar1 == ExecutionModelGLCompute) || (EVar1 - ExecutionModelTaskEXT < 2)) {
    if (((local_18->workgroup_size).constant != 0) ||
       (bVar3 = Bitset::get(&local_18->flags,0x26), bVar3)) {
      SpecializationConstant::SpecializationConstant(&wg_y);
      SpecializationConstant::SpecializationConstant(&wg_z);
      SpecializationConstant::SpecializationConstant(&local_894);
      Compiler::get_work_group_size_specialization_constants
                (&this->super_Compiler,&wg_y,&wg_z,&local_894);
      bVar3 = true;
      wg_y_00 = this;
      if (((this->options).vulkan_semantics & 1U) == 0) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_y);
        TypedID<(spirv_cross::Types)3>::TypedID(&local_898,0);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_898);
        wg_y_00 = (CompilerGLSL *)(ulong)uVar4;
        bVar3 = false;
        if (uVar4 == uVar5) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&wg_z);
          TypedID<(spirv_cross::Types)3>::TypedID(&local_89c,0);
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_89c);
          wg_y_00 = (CompilerGLSL *)(ulong)uVar4;
          bVar3 = false;
          if (uVar4 == uVar5) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_894);
            TypedID<(spirv_cross::Types)3>::TypedID(&local_8a0,0);
            uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_8a0);
            wg_y_00 = (CompilerGLSL *)(ulong)uVar5;
            bVar3 = uVar4 == uVar5;
          }
        }
      }
      if (bVar3) {
        wg_y_00 = (CompilerGLSL *)&wg_z;
        build_workgroup_size
                  (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)(outputs.stack_storage.aligned_char + 0xf8),&wg_y,
                   (SpecializationConstant *)wg_y_00,&local_894);
      }
    }
    else {
      join<char_const(&)[16],unsigned_int&>
                (&local_8c0,(spirv_cross *)"local_size_x = ",
                 (char (*) [16])&local_18->workgroup_size,(uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_8c0);
      ::std::__cxx11::string::~string((string *)&local_8c0);
      join<char_const(&)[16],unsigned_int&>
                (&local_8e0,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&(local_18->workgroup_size).y,(uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_8e0);
      ::std::__cxx11::string::~string((string *)&local_8e0);
      join<char_const(&)[16],unsigned_int&>
                (&local_900,(spirv_cross *)"local_size_z = ",
                 (char (*) [16])&(local_18->workgroup_size).z,(uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)(outputs.stack_storage.aligned_char + 0xf8),&local_900);
      ::std::__cxx11::string::~string((string *)&local_900);
    }
    if (local_18->model == ExecutionModelMeshEXT) {
      join<char_const(&)[16],unsigned_int&>
                (&local_920,(spirv_cross *)"max_vertices = ",
                 (char (*) [16])&local_18->output_vertices,(uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_558,&local_920);
      ::std::__cxx11::string::~string((string *)&local_920);
      join<char_const(&)[18],unsigned_int&>
                (&local_940,(spirv_cross *)"max_primitives = ",
                 (char (*) [18])&local_18->output_primitives,(uint *)wg_y_00);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_558,&local_940);
      ::std::__cxx11::string::~string((string *)&local_940);
      bVar3 = Bitset::get(&local_18->flags,0x14b2);
      if (bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_960,"triangles",&local_961);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_558,&local_960);
        ::std::__cxx11::string::~string((string *)&local_960);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_961);
      }
      else {
        bVar3 = Bitset::get(&local_18->flags,0x1495);
        if (bVar3) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_988,"lines",&local_989);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_558,&local_988);
          ::std::__cxx11::string::~string((string *)&local_988);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_989);
        }
        else {
          bVar3 = Bitset::get(&local_18->flags,0x1b);
          if (bVar3) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_9b0,"points",&local_9b1);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_558,&local_9b0);
            ::std::__cxx11::string::~string((string *)&local_9b0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
          }
        }
      }
    }
  }
  __begin1_2 = (Capability *)&(this->super_Compiler).ir.declared_capabilities;
  __end1_2 = VectorView<spv::Capability>::begin((VectorView<spv::Capability> *)__begin1_2);
  cap = VectorView<spv::Capability>::end((VectorView<spv::Capability> *)__begin1_2);
  for (; __end1_2 != cap; __end1_2 = __end1_2 + 1) {
    local_a28 = __end1_2;
    if (*__end1_2 == CapabilityRayTraversalPrimitiveCullingKHR) {
      statement<char_const(&)[27]>(this,(char (*) [27])"layout(primitive_culling);");
    }
  }
  bVar3 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(outputs.stack_storage.aligned_char + 0xf8));
  if (!bVar3) {
    merge(&local_a48,
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *)(outputs.stack_storage.aligned_char + 0xf8),", ");
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
              (this,(char (*) [8])"layout(",&local_a48,(char (*) [6])0x4a7d12);
    ::std::__cxx11::string::~string((string *)&local_a48);
  }
  bVar3 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_558);
  if (!bVar3) {
    merge(&local_a68,
          (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
           *)local_558,", ");
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[7]>
              (this,(char (*) [8])"layout(",&local_a68,(char (*) [7])") out;");
    ::std::__cxx11::string::~string((string *)&local_a68);
  }
  statement<char_const(&)[1]>(this,(char (*) [1])0x48ca95);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_558);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)(outputs.stack_storage.aligned_char + 0xf8));
  return;
}

Assistant:

void CompilerGLSL::emit_header()
{
	auto &execution = get_entry_point();
	statement("#version ", options.version, options.es && options.version > 100 ? " es" : "");

	if (!options.es && options.version < 420)
	{
		// Needed for binding = # on UBOs, etc.
		if (options.enable_420pack_extension)
		{
			statement("#ifdef GL_ARB_shading_language_420pack");
			statement("#extension GL_ARB_shading_language_420pack : require");
			statement("#endif");
		}
		// Needed for: layout(early_fragment_tests) in;
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			require_extension_internal("GL_ARB_shader_image_load_store");
	}

	// Needed for: layout(post_depth_coverage) in;
	if (execution.flags.get(ExecutionModePostDepthCoverage))
		require_extension_internal("GL_ARB_post_depth_coverage");

	// Needed for: layout({pixel,sample}_interlock_[un]ordered) in;
	bool interlock_used = execution.flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	                      execution.flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	                      execution.flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	                      execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT);

	if (interlock_used)
	{
		if (options.es)
		{
			if (options.version < 310)
				SPIRV_CROSS_THROW("At least ESSL 3.10 required for fragment shader interlock.");
			require_extension_internal("GL_NV_fragment_shader_interlock");
		}
		else
		{
			if (options.version < 420)
				require_extension_internal("GL_ARB_shader_image_load_store");
			require_extension_internal("GL_ARB_fragment_shader_interlock");
		}
	}

	for (auto &ext : forced_extensions)
	{
		if (ext == "GL_ARB_gpu_shader_int64")
		{
			statement("#if defined(GL_ARB_gpu_shader_int64)");
			statement("#extension GL_ARB_gpu_shader_int64 : require");
			if (!options.vulkan_semantics || options.es)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			statement("#else");
			statement("#error No extension available for 64-bit integers.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_float16")
		{
			// Special case, this extension has a potential fallback to another vendor extension in normal GLSL.
			// GL_AMD_gpu_shader_half_float is a superset, so try that first.
			statement("#if defined(GL_AMD_gpu_shader_half_float)");
			statement("#extension GL_AMD_gpu_shader_half_float : require");
			if (!options.vulkan_semantics)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			else
			{
				statement("#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
			}
			statement("#else");
			statement("#error No extension available for FP16.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int8")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
			else
			{
				statement("#if defined(GL_EXT_shader_explicit_arithmetic_types_int8)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
				statement("#else");
				statement("#error No extension available for Int8.");
				statement("#endif");
			}
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int16")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
			else
			{
				statement("#if defined(GL_EXT_shader_explicit_arithmetic_types_int16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
				statement("#elif defined(GL_AMD_gpu_shader_int16)");
				statement("#extension GL_AMD_gpu_shader_int16 : require");
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
				statement("#else");
				statement("#error No extension available for Int16.");
				statement("#endif");
			}
		}
		else if (ext == "GL_ARB_post_depth_coverage")
		{
			if (options.es)
				statement("#extension GL_EXT_post_depth_coverage : require");
			else
			{
				statement("#if defined(GL_ARB_post_depth_coverge)");
				statement("#extension GL_ARB_post_depth_coverage : require");
				statement("#else");
				statement("#extension GL_EXT_post_depth_coverage : require");
				statement("#endif");
			}
		}
		else if (!options.vulkan_semantics && ext == "GL_ARB_shader_draw_parameters")
		{
			// Soft-enable this extension on plain GLSL.
			statement("#ifdef ", ext);
			statement("#extension ", ext, " : enable");
			statement("#endif");
		}
		else if (ext == "GL_EXT_control_flow_attributes")
		{
			// These are just hints so we can conditionally enable and fallback in the shader.
			statement("#if defined(GL_EXT_control_flow_attributes)");
			statement("#extension GL_EXT_control_flow_attributes : require");
			statement("#define SPIRV_CROSS_FLATTEN [[flatten]]");
			statement("#define SPIRV_CROSS_BRANCH [[dont_flatten]]");
			statement("#define SPIRV_CROSS_UNROLL [[unroll]]");
			statement("#define SPIRV_CROSS_LOOP [[dont_unroll]]");
			statement("#else");
			statement("#define SPIRV_CROSS_FLATTEN");
			statement("#define SPIRV_CROSS_BRANCH");
			statement("#define SPIRV_CROSS_UNROLL");
			statement("#define SPIRV_CROSS_LOOP");
			statement("#endif");
		}
		else if (ext == "GL_NV_fragment_shader_interlock")
		{
			statement("#extension GL_NV_fragment_shader_interlock : require");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockNV()");
			statement("#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockNV()");
		}
		else if (ext == "GL_ARB_fragment_shader_interlock")
		{
			statement("#ifdef GL_ARB_fragment_shader_interlock");
			statement("#extension GL_ARB_fragment_shader_interlock : enable");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockARB()");
			statement("#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockARB()");
			statement("#elif defined(GL_INTEL_fragment_shader_ordering)");
			statement("#extension GL_INTEL_fragment_shader_ordering : enable");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginFragmentShaderOrderingINTEL()");
			statement("#define SPIRV_Cross_endInvocationInterlock()");
			statement("#endif");
		}
		else
			statement("#extension ", ext, " : require");
	}

	if (!options.vulkan_semantics)
	{
		using Supp = ShaderSubgroupSupportHelper;
		auto result = shader_subgroup_supporter.resolve();

		for (uint32_t feature_index = 0; feature_index < Supp::FeatureCount; feature_index++)
		{
			auto feature = static_cast<Supp::Feature>(feature_index);
			if (!shader_subgroup_supporter.is_feature_requested(feature))
				continue;

			auto exts = Supp::get_candidates_for_feature(feature, result);
			if (exts.empty())
				continue;

			statement("");

			for (auto &ext : exts)
			{
				const char *name = Supp::get_extension_name(ext);
				const char *extra_predicate = Supp::get_extra_required_extension_predicate(ext);
				auto extra_names = Supp::get_extra_required_extension_names(ext);
				statement(&ext != &exts.front() ? "#elif" : "#if", " defined(", name, ")",
				          (*extra_predicate != '\0' ? " && " : ""), extra_predicate);
				for (const auto &e : extra_names)
					statement("#extension ", e, " : enable");
				statement("#extension ", name, " : require");
			}

			if (!Supp::can_feature_be_implemented_without_extensions(feature))
			{
				statement("#else");
				statement("#error No extensions available to emulate requested subgroup feature.");
			}

			statement("#endif");
		}
	}

	for (auto &header : header_lines)
		statement(header);

	SmallVector<string> inputs;
	SmallVector<string> outputs;

	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (options.ovr_multiview_view_count)
			inputs.push_back(join("num_views = ", options.ovr_multiview_view_count));
		break;
	case ExecutionModelGeometry:
		if ((execution.flags.get(ExecutionModeInvocations)) && execution.invocations != 1)
			inputs.push_back(join("invocations = ", execution.invocations));
		if (execution.flags.get(ExecutionModeInputPoints))
			inputs.push_back("points");
		if (execution.flags.get(ExecutionModeInputLines))
			inputs.push_back("lines");
		if (execution.flags.get(ExecutionModeInputLinesAdjacency))
			inputs.push_back("lines_adjacency");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeInputTrianglesAdjacency))
			inputs.push_back("triangles_adjacency");

		if (!execution.geometry_passthrough)
		{
			// For passthrough, these are implies and cannot be declared in shader.
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			if (execution.flags.get(ExecutionModeOutputTriangleStrip))
				outputs.push_back("triangle_strip");
			if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
			if (execution.flags.get(ExecutionModeOutputLineStrip))
				outputs.push_back("line_strip");
		}
		break;

	case ExecutionModelTessellationControl:
		if (execution.flags.get(ExecutionModeOutputVertices))
			outputs.push_back(join("vertices = ", execution.output_vertices));
		break;

	case ExecutionModelTessellationEvaluation:
		if (execution.flags.get(ExecutionModeQuads))
			inputs.push_back("quads");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeIsolines))
			inputs.push_back("isolines");
		if (execution.flags.get(ExecutionModePointMode))
			inputs.push_back("point_mode");

		if (!execution.flags.get(ExecutionModeIsolines))
		{
			if (execution.flags.get(ExecutionModeVertexOrderCw))
				inputs.push_back("cw");
			if (execution.flags.get(ExecutionModeVertexOrderCcw))
				inputs.push_back("ccw");
		}

		if (execution.flags.get(ExecutionModeSpacingFractionalEven))
			inputs.push_back("fractional_even_spacing");
		if (execution.flags.get(ExecutionModeSpacingFractionalOdd))
			inputs.push_back("fractional_odd_spacing");
		if (execution.flags.get(ExecutionModeSpacingEqual))
			inputs.push_back("equal_spacing");
		break;

	case ExecutionModelGLCompute:
	case ExecutionModelTaskEXT:
	case ExecutionModelMeshEXT:
	{
		if (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId))
		{
			SpecializationConstant wg_x, wg_y, wg_z;
			get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

			// If there are any spec constants on legacy GLSL, defer declaration, we need to set up macro
			// declarations before we can emit the work group size.
			if (options.vulkan_semantics ||
			    ((wg_x.id == ConstantID(0)) && (wg_y.id == ConstantID(0)) && (wg_z.id == ConstantID(0))))
				build_workgroup_size(inputs, wg_x, wg_y, wg_z);
		}
		else
		{
			inputs.push_back(join("local_size_x = ", execution.workgroup_size.x));
			inputs.push_back(join("local_size_y = ", execution.workgroup_size.y));
			inputs.push_back(join("local_size_z = ", execution.workgroup_size.z));
		}

		if (execution.model == ExecutionModelMeshEXT)
		{
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			outputs.push_back(join("max_primitives = ", execution.output_primitives));
			if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
				outputs.push_back("triangles");
			else if (execution.flags.get(ExecutionModeOutputLinesEXT))
				outputs.push_back("lines");
			else if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
		}
		break;
	}

	case ExecutionModelFragment:
		if (options.es)
		{
			switch (options.fragment.default_float_precision)
			{
			case Options::Lowp:
				statement("precision lowp float;");
				break;

			case Options::Mediump:
				statement("precision mediump float;");
				break;

			case Options::Highp:
				statement("precision highp float;");
				break;

			default:
				break;
			}

			switch (options.fragment.default_int_precision)
			{
			case Options::Lowp:
				statement("precision lowp int;");
				break;

			case Options::Mediump:
				statement("precision mediump int;");
				break;

			case Options::Highp:
				statement("precision highp int;");
				break;

			default:
				break;
			}
		}

		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			inputs.push_back("early_fragment_tests");
		if (execution.flags.get(ExecutionModePostDepthCoverage))
			inputs.push_back("post_depth_coverage");

		if (interlock_used)
			statement("#if defined(GL_ARB_fragment_shader_interlock)");

		if (execution.flags.get(ExecutionModePixelInterlockOrderedEXT))
			statement("layout(pixel_interlock_ordered) in;");
		else if (execution.flags.get(ExecutionModePixelInterlockUnorderedEXT))
			statement("layout(pixel_interlock_unordered) in;");
		else if (execution.flags.get(ExecutionModeSampleInterlockOrderedEXT))
			statement("layout(sample_interlock_ordered) in;");
		else if (execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT))
			statement("layout(sample_interlock_unordered) in;");

		if (interlock_used)
		{
			statement("#elif !defined(GL_INTEL_fragment_shader_ordering)");
			statement("#error Fragment Shader Interlock/Ordering extension missing!");
			statement("#endif");
		}

		if (!options.es && execution.flags.get(ExecutionModeDepthGreater))
			statement("layout(depth_greater) out float gl_FragDepth;");
		else if (!options.es && execution.flags.get(ExecutionModeDepthLess))
			statement("layout(depth_less) out float gl_FragDepth;");

		break;

	default:
		break;
	}

	for (auto &cap : ir.declared_capabilities)
		if (cap == CapabilityRayTraversalPrimitiveCullingKHR)
			statement("layout(primitive_culling);");

	if (!inputs.empty())
		statement("layout(", merge(inputs), ") in;");
	if (!outputs.empty())
		statement("layout(", merge(outputs), ") out;");

	statement("");
}